

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O3

FString I_GetFromClipboard(bool use_primary_selection)

{
  undefined7 in_register_00000039;
  
  FString::FString((FString *)CONCAT71(in_register_00000039,use_primary_selection),(char *)"");
  return (FString)(char *)CONCAT71(in_register_00000039,use_primary_selection);
}

Assistant:

FString I_GetFromClipboard (bool use_primary_selection)
{
#ifndef NO_GTK
	if (GtkAvailable)
	{
		GtkClipboard *clipboard = gtk_clipboard_get(use_primary_selection ?
			GDK_SELECTION_PRIMARY : GDK_SELECTION_CLIPBOARD);
		if (clipboard != NULL)
		{
			gchar *text = gtk_clipboard_wait_for_text(clipboard);
			if (text != NULL)
			{
				FString copy(text);
				g_free(text);
				return copy;
			}
		}
	}
#elif defined __APPLE__
	FString result;

	if (NULL == s_clipboard)
	{
		PasteboardCreate(kPasteboardClipboard, &s_clipboard);
	}

	PasteboardSynchronize(s_clipboard);

	ItemCount itemCount = 0;
	PasteboardGetItemCount(s_clipboard, &itemCount);

	if (0 == itemCount)
	{
		return FString();
	}

	PasteboardItemID itemID;

	if (0 != PasteboardGetItemIdentifier(s_clipboard, 1, &itemID))
	{
		return FString();
	}

	if (CFDataRef data = GetPasteboardData(itemID, kUTTypeUTF8PlainText))
	{
		const CFIndex bufferLength = CFDataGetLength(data);
		char* const buffer = result.LockNewBuffer(bufferLength);

		memcpy(buffer, CFDataGetBytePtr(data), bufferLength);

		result.UnlockBuffer();
	}
	else if (CFDataRef data = GetPasteboardData(itemID, kUTTypeUTF16PlainText))
	{
#ifdef __LITTLE_ENDIAN__
		static const CFStringEncoding ENCODING = kCFStringEncodingUTF16LE;
#else // __BIG_ENDIAN__
		static const CFStringEncoding ENCODING = kCFStringEncodingUTF16BE;
#endif // __LITTLE_ENDIAN__

		if (const CFStringRef utf16 = CFStringCreateFromExternalRepresentation(kCFAllocatorDefault, data, ENCODING))
		{
			const CFRange range = { 0, CFStringGetLength(utf16) };
			CFIndex bufferLength = 0;

			if (CFStringGetBytes(utf16, range, kCFStringEncodingUTF8, '?', false, NULL, 0, &bufferLength) > 0)
			{
				UInt8* const buffer = reinterpret_cast<UInt8*>(result.LockNewBuffer(bufferLength));

				CFStringGetBytes(utf16, range, kCFStringEncodingUTF8, '?', false, buffer, bufferLength, NULL);

				result.UnlockBuffer();
			}

			CFRelease(utf16);
		}
	}

	return result;
#endif
	return "";
}